

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mei.c
# Opt level: O3

ssize_t mei_send_msg(mei *me,uchar *buffer,size_t len)

{
  int iVar1;
  mei_log_callback p_Var2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  char *pcVar6;
  long lVar7;
  
  if (buffer == (uchar *)0x0 || me == (mei *)0x0) {
    return -0x16;
  }
  if (MEI_LOG_LEVEL_ERROR < me->log_level) {
    if (me->log_callback == (mei_log_callback)0x0) {
      __syslog_chk(7,1,"call write length = %zu\n",len);
    }
    else {
      (*me->log_callback)(false,"call write length = %zu\n",len);
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  sVar5 = write(me->fd,buffer,len);
  iVar1 = *piVar4;
  me->last_err = iVar1;
  lVar7 = (long)-iVar1;
  if (0 < sVar5) {
    lVar7 = sVar5;
  }
  if (-1 < lVar7) {
    return lVar7;
  }
  if (iVar1 < 0x13) {
    if (iVar1 != 0) {
      if (iVar1 != 0x10) {
LAB_00121ccb:
        iVar3 = 6;
        goto LAB_00121cd0;
      }
      goto LAB_00121cbf;
    }
  }
  else {
    if (iVar1 == 0x13) {
LAB_00121cbf:
      iVar3 = 3;
      goto LAB_00121cd0;
    }
    iVar3 = 4;
    if (iVar1 == 0x19) goto LAB_00121cd0;
    if (iVar1 != 0x5f) goto LAB_00121ccb;
  }
  iVar3 = me->state;
LAB_00121cd0:
  me->state = iVar3;
  if (me->log_level != MEI_LOG_LEVEL_QUIET) {
    p_Var2 = me->log_callback;
    pcVar6 = strerror(-(int)lVar7);
    if (p_Var2 == (mei_log_callback)0x0) {
      __syslog_chk(3,1,"me: error: write failed with status [%zd]:%s\n",lVar7,pcVar6);
    }
    else {
      (*p_Var2)(true,"me: error: write failed with status [%zd]:%s\n",lVar7,pcVar6);
    }
  }
  return lVar7;
}

Assistant:

ssize_t mei_send_msg(struct mei *me, const unsigned char *buffer, size_t len)
{
	ssize_t rc;

	if (!me || !buffer)
		return -EINVAL;

	mei_msg(me, "call write length = %zu\n", len);
	mei_dump_hex_buffer(me, buffer, len);

	rc  = __mei_write(me, buffer, len);
	if (rc < 0) {
		me->state = __mei_errno_to_state(me);
		mei_err(me, "write failed with status [%zd]:%s\n",
			rc, strerror(-rc));
		return rc;
	}

	return rc;
}